

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O2

void __thiscall
nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::reset
          (cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *this)

{
  __shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::mutex::lock(&this->lock_);
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->err_).super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>,&local_28)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  this->code_ = OK;
  this->has_result_ = false;
  this->accepted_ = false;
  std::function<void_(std::shared_ptr<nuraft::buffer>_&,_std::shared_ptr<std::exception>_&)>::
  operator=(&this->handler_,(nullptr_t)0x0);
  std::
  function<void_(nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_&,_std::shared_ptr<std::exception>_&)>
  ::operator=(&this->handler2_,(nullptr_t)0x0);
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->result_).super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2> *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  return;
}

Assistant:

void reset() {
        std::lock_guard<std::mutex> guard(lock_);
        err_ = TE();
        code_ = cmd_result_code::OK;
        has_result_ = false;
        accepted_ = false;
        handler_ = nullptr;
        handler2_ = nullptr;
        result_ = T();
    }